

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_bitset_container_lazy_xor
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  rle16_t rVar1;
  int local_24;
  rle16_t rle;
  int32_t rlepos;
  bitset_container_t *dst_local;
  bitset_container_t *src_2_local;
  run_container_t *src_1_local;
  
  if (src_2 != dst) {
    bitset_container_copy(src_2,dst);
  }
  for (local_24 = 0; local_24 < src_1->n_runs; local_24 = local_24 + 1) {
    rVar1 = src_1->runs[local_24];
    bitset_flip_range(dst->words,(uint)rVar1 & 0xffff,
                      ((uint)rVar1 & 0xffff) + ((uint)rVar1 >> 0x10) + 1);
  }
  dst->cardinality = -1;
  return;
}

Assistant:

void run_bitset_container_lazy_xor(const run_container_t *src_1,
                                   const bitset_container_t *src_2,
                                   bitset_container_t *dst) {
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_flip_range(dst->words, rle.value,
                          rle.value + rle.length + UINT32_C(1));
    }
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}